

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

shared_ptr<char> __thiscall QUtil::make_shared_cstr(QUtil *this,string *str)

{
  void *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<char> sVar2;
  
  pvVar1 = operator_new__(str->_M_string_length + 1);
  *(void **)this = pvVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<char*,std::default_delete<char[]>,std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pvVar1);
  *(undefined1 *)(*(long *)this + str->_M_string_length) = 0;
  memcpy(*(void **)this,(str->_M_dataplus)._M_p,str->_M_string_length);
  sVar2.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<char>)sVar2.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<char>
QUtil::make_shared_cstr(std::string const& str)
{
    auto result = QUtil::make_shared_array<char>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}